

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O0

unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
 __thiscall
spvtools::opt::analysis::ConstantManager::CreateConstant
          (ConstantManager *this,Type *type,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *literal_words_or_ids)

{
  bool bVar1;
  size_type sVar2;
  const_reference args_1;
  reference ppCVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  unique_ptr<spvtools::opt::analysis::ArrayConstant,_std::default_delete<spvtools::opt::analysis::ArrayConstant>_>
  local_140;
  undefined1 local_138 [8];
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  components_3;
  Array *at;
  undefined1 local_110 [8];
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  components_2;
  Struct *st;
  undefined1 local_e8 [8];
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  components_1;
  Matrix *mt;
  Type **local_c0;
  Constant **local_b8;
  __normal_iterator<const_spvtools::opt::analysis::Constant_**,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
  local_b0;
  Type *local_a8;
  Type *component_type;
  Constant **local_98;
  Constant **local_90;
  undefined4 local_84;
  undefined1 local_80 [8];
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  components;
  Vector *vt;
  Float *local_58;
  Float *ft;
  Integer *local_48;
  Integer *it;
  Bool *local_38;
  Bool *bt;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_28;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *literal_words_or_ids_local;
  Type *type_local;
  ConstantManager *this_local;
  
  local_28 = in_RCX;
  literal_words_or_ids_local = literal_words_or_ids;
  type_local = type;
  this_local = this;
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RCX);
  if (sVar2 == 0) {
    MakeUnique<spvtools::opt::analysis::NullConstant,spvtools::opt::analysis::Type_const*&>
              ((spvtools *)&bt,(Type **)&literal_words_or_ids_local);
    std::
    unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
    ::
    unique_ptr<spvtools::opt::analysis::NullConstant,std::default_delete<spvtools::opt::analysis::NullConstant>,void>
              ((unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                *)this,(unique_ptr<spvtools::opt::analysis::NullConstant,_std::default_delete<spvtools::opt::analysis::NullConstant>_>
                        *)&bt);
    std::
    unique_ptr<spvtools::opt::analysis::NullConstant,_std::default_delete<spvtools::opt::analysis::NullConstant>_>
    ::~unique_ptr((unique_ptr<spvtools::opt::analysis::NullConstant,_std::default_delete<spvtools::opt::analysis::NullConstant>_>
                   *)&bt);
  }
  else {
    local_38 = (Bool *)(**(code **)((literal_words_or_ids_local->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_start + 0x10))();
    if (local_38 == (Bool *)0x0) {
      local_48 = (Integer *)
                 (**(code **)((literal_words_or_ids_local->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start + 0x14))();
      if (local_48 == (Integer *)0x0) {
        local_58 = (Float *)(**(code **)((literal_words_or_ids_local->
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 0x18))();
        if (local_58 == (Float *)0x0) {
          components.
          super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)(**(code **)((literal_words_or_ids_local->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 0x1c))();
          if (components.
              super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
            components_1.
            super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)(**(code **)((literal_words_or_ids_local->
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 0x20))();
            if (components_1.
                super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
              components_2.
              super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)(**(code **)((literal_words_or_ids_local->
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 0x38))();
              if (components_2.
                  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
                components_3.
                super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)(**(code **)((literal_words_or_ids_local->
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           )._M_impl.super__Vector_impl_data._M_start + 0x30))();
                if (components_3.
                    super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
                  std::
                  unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                  ::unique_ptr<std::default_delete<spvtools::opt::analysis::Constant>,void>
                            ((unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                              *)this,(nullptr_t)0x0);
                }
                else {
                  GetConstantsFromIds((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                       *)local_138,(ConstantManager *)type,local_28);
                  bVar1 = std::
                          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                          ::empty((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                   *)local_138);
                  if (bVar1) {
                    std::
                    unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                    ::unique_ptr<std::default_delete<spvtools::opt::analysis::Constant>,void>
                              ((unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                                *)this,(nullptr_t)0x0);
                  }
                  else {
                    MakeUnique<spvtools::opt::analysis::ArrayConstant,spvtools::opt::analysis::Array_const*&,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>&>
                              ((spvtools *)&local_140,
                               (Array **)
                               &components_3.
                                super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                *)local_138);
                    std::
                    unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                    ::
                    unique_ptr<spvtools::opt::analysis::ArrayConstant,std::default_delete<spvtools::opt::analysis::ArrayConstant>,void>
                              ((unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                                *)this,&local_140);
                    std::
                    unique_ptr<spvtools::opt::analysis::ArrayConstant,_std::default_delete<spvtools::opt::analysis::ArrayConstant>_>
                    ::~unique_ptr(&local_140);
                  }
                  local_84 = 1;
                  std::
                  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  ::~vector((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                             *)local_138);
                }
              }
              else {
                GetConstantsFromIds((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                     *)local_110,(ConstantManager *)type,local_28);
                bVar1 = std::
                        vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                        ::empty((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                 *)local_110);
                if (bVar1) {
                  std::
                  unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                  ::unique_ptr<std::default_delete<spvtools::opt::analysis::Constant>,void>
                            ((unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                              *)this,(nullptr_t)0x0);
                }
                else {
                  MakeUnique<spvtools::opt::analysis::StructConstant,spvtools::opt::analysis::Struct_const*&,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>&>
                            ((spvtools *)&at,
                             (Struct **)
                             &components_2.
                              super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                              *)local_110);
                  std::
                  unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                  ::
                  unique_ptr<spvtools::opt::analysis::StructConstant,std::default_delete<spvtools::opt::analysis::StructConstant>,void>
                            ((unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                              *)this,(unique_ptr<spvtools::opt::analysis::StructConstant,_std::default_delete<spvtools::opt::analysis::StructConstant>_>
                                      *)&at);
                  std::
                  unique_ptr<spvtools::opt::analysis::StructConstant,_std::default_delete<spvtools::opt::analysis::StructConstant>_>
                  ::~unique_ptr((unique_ptr<spvtools::opt::analysis::StructConstant,_std::default_delete<spvtools::opt::analysis::StructConstant>_>
                                 *)&at);
                }
                local_84 = 1;
                std::
                vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                ::~vector((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                           *)local_110);
              }
            }
            else {
              GetConstantsFromIds((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                   *)local_e8,(ConstantManager *)type,local_28);
              bVar1 = std::
                      vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                      ::empty((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                               *)local_e8);
              if (bVar1) {
                std::
                unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                ::unique_ptr<std::default_delete<spvtools::opt::analysis::Constant>,void>
                          ((unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                            *)this,(nullptr_t)0x0);
              }
              else {
                MakeUnique<spvtools::opt::analysis::MatrixConstant,spvtools::opt::analysis::Matrix_const*&,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>&>
                          ((spvtools *)&st,
                           (Matrix **)
                           &components_1.
                            super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                            *)local_e8);
                std::
                unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                ::
                unique_ptr<spvtools::opt::analysis::MatrixConstant,std::default_delete<spvtools::opt::analysis::MatrixConstant>,void>
                          ((unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                            *)this,(unique_ptr<spvtools::opt::analysis::MatrixConstant,_std::default_delete<spvtools::opt::analysis::MatrixConstant>_>
                                    *)&st);
                std::
                unique_ptr<spvtools::opt::analysis::MatrixConstant,_std::default_delete<spvtools::opt::analysis::MatrixConstant>_>
                ::~unique_ptr((unique_ptr<spvtools::opt::analysis::MatrixConstant,_std::default_delete<spvtools::opt::analysis::MatrixConstant>_>
                               *)&st);
              }
              local_84 = 1;
              std::
              vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
              ::~vector((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                         *)local_e8);
            }
          }
          else {
            GetConstantsFromIds((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                 *)local_80,(ConstantManager *)type,local_28);
            bVar1 = std::
                    vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                    ::empty((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                             *)local_80);
            if (bVar1) {
              std::
              unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
              ::unique_ptr<std::default_delete<spvtools::opt::analysis::Constant>,void>
                        ((unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                          *)this,(nullptr_t)0x0);
            }
            else {
              local_90 = (Constant **)
                         std::
                         vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                         ::begin((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                  *)local_80);
              local_98 = (Constant **)
                         std::
                         vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                         ::end((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                *)local_80);
              bVar1 = std::
                      all_of<__gnu_cxx::__normal_iterator<spvtools::opt::analysis::Constant_const**,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>>,spvtools::opt::analysis::ConstantManager::CreateConstant(spvtools::opt::analysis::Type_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)const::__0>
                                (local_90,local_98);
              if (bVar1) {
                ppCVar3 = std::
                          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                          ::front((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                   *)local_80);
                local_a8 = Constant::type(*ppCVar3);
                local_b0._M_current =
                     (Constant **)
                     std::
                     vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                     ::begin((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                              *)local_80);
                local_b8 = (Constant **)
                           std::
                           vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                           ::end((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                  *)local_80);
                local_c0 = &local_a8;
                bVar1 = std::
                        all_of<__gnu_cxx::__normal_iterator<spvtools::opt::analysis::Constant_const**,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>>,spvtools::opt::analysis::ConstantManager::CreateConstant(spvtools::opt::analysis::Type_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)const::__1>
                                  (local_b0,(__normal_iterator<const_spvtools::opt::analysis::Constant_**,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
                                             )local_b8,(anon_class_8_1_809a237a)local_c0);
                if (bVar1) {
                  MakeUnique<spvtools::opt::analysis::VectorConstant,spvtools::opt::analysis::Vector_const*&,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>&>
                            ((spvtools *)&mt,
                             (Vector **)
                             &components.
                              super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                              *)local_80);
                  std::
                  unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                  ::
                  unique_ptr<spvtools::opt::analysis::VectorConstant,std::default_delete<spvtools::opt::analysis::VectorConstant>,void>
                            ((unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                              *)this,(unique_ptr<spvtools::opt::analysis::VectorConstant,_std::default_delete<spvtools::opt::analysis::VectorConstant>_>
                                      *)&mt);
                  std::
                  unique_ptr<spvtools::opt::analysis::VectorConstant,_std::default_delete<spvtools::opt::analysis::VectorConstant>_>
                  ::~unique_ptr((unique_ptr<spvtools::opt::analysis::VectorConstant,_std::default_delete<spvtools::opt::analysis::VectorConstant>_>
                                 *)&mt);
                }
                else {
                  std::
                  unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                  ::unique_ptr<std::default_delete<spvtools::opt::analysis::Constant>,void>
                            ((unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                              *)this,(nullptr_t)0x0);
                }
              }
              else {
                std::
                unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                ::unique_ptr<std::default_delete<spvtools::opt::analysis::Constant>,void>
                          ((unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                            *)this,(nullptr_t)0x0);
              }
            }
            local_84 = 1;
            std::
            vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            ::~vector((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                       *)local_80);
          }
        }
        else {
          MakeUnique<spvtools::opt::analysis::FloatConstant,spvtools::opt::analysis::Float_const*&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
                    ((spvtools *)&vt,&local_58,local_28);
          std::
          unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
          ::
          unique_ptr<spvtools::opt::analysis::FloatConstant,std::default_delete<spvtools::opt::analysis::FloatConstant>,void>
                    ((unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                      *)this,(unique_ptr<spvtools::opt::analysis::FloatConstant,_std::default_delete<spvtools::opt::analysis::FloatConstant>_>
                              *)&vt);
          std::
          unique_ptr<spvtools::opt::analysis::FloatConstant,_std::default_delete<spvtools::opt::analysis::FloatConstant>_>
          ::~unique_ptr((unique_ptr<spvtools::opt::analysis::FloatConstant,_std::default_delete<spvtools::opt::analysis::FloatConstant>_>
                         *)&vt);
        }
      }
      else {
        MakeUnique<spvtools::opt::analysis::IntConstant,spvtools::opt::analysis::Integer_const*&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
                  ((spvtools *)&ft,&local_48,local_28);
        std::
        unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
        ::
        unique_ptr<spvtools::opt::analysis::IntConstant,std::default_delete<spvtools::opt::analysis::IntConstant>,void>
                  ((unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                    *)this,(unique_ptr<spvtools::opt::analysis::IntConstant,_std::default_delete<spvtools::opt::analysis::IntConstant>_>
                            *)&ft);
        std::
        unique_ptr<spvtools::opt::analysis::IntConstant,_std::default_delete<spvtools::opt::analysis::IntConstant>_>
        ::~unique_ptr((unique_ptr<spvtools::opt::analysis::IntConstant,_std::default_delete<spvtools::opt::analysis::IntConstant>_>
                       *)&ft);
      }
    }
    else {
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_28);
      if (sVar2 != 1) {
        __assert_fail("literal_words_or_ids.size() == 1 && \"Bool constant should be declared with one operand\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/constants.cpp"
                      ,0xf9,
                      "std::unique_ptr<Constant> spvtools::opt::analysis::ConstantManager::CreateConstant(const Type *, const std::vector<uint32_t> &) const"
                     );
      }
      args_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(local_28);
      MakeUnique<spvtools::opt::analysis::BoolConstant,spvtools::opt::analysis::Bool_const*&,unsigned_int_const&>
                ((spvtools *)&it,&local_38,args_1);
      std::
      unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
      ::
      unique_ptr<spvtools::opt::analysis::BoolConstant,std::default_delete<spvtools::opt::analysis::BoolConstant>,void>
                ((unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>
                  *)this,(unique_ptr<spvtools::opt::analysis::BoolConstant,_std::default_delete<spvtools::opt::analysis::BoolConstant>_>
                          *)&it);
      std::
      unique_ptr<spvtools::opt::analysis::BoolConstant,_std::default_delete<spvtools::opt::analysis::BoolConstant>_>
      ::~unique_ptr((unique_ptr<spvtools::opt::analysis::BoolConstant,_std::default_delete<spvtools::opt::analysis::BoolConstant>_>
                     *)&it);
    }
  }
  return (__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Constant> ConstantManager::CreateConstant(
    const Type* type, const std::vector<uint32_t>& literal_words_or_ids) const {
  if (literal_words_or_ids.size() == 0) {
    // Constant declared with OpConstantNull
    return MakeUnique<NullConstant>(type);
  } else if (auto* bt = type->AsBool()) {
    assert(literal_words_or_ids.size() == 1 &&
           "Bool constant should be declared with one operand");
    return MakeUnique<BoolConstant>(bt, literal_words_or_ids.front());
  } else if (auto* it = type->AsInteger()) {
    return MakeUnique<IntConstant>(it, literal_words_or_ids);
  } else if (auto* ft = type->AsFloat()) {
    return MakeUnique<FloatConstant>(ft, literal_words_or_ids);
  } else if (auto* vt = type->AsVector()) {
    auto components = GetConstantsFromIds(literal_words_or_ids);
    if (components.empty()) return nullptr;
    // All components of VectorConstant must be of type Bool, Integer or Float.
    if (!std::all_of(components.begin(), components.end(),
                     [](const Constant* c) {
                       if (c->type()->AsBool() || c->type()->AsInteger() ||
                           c->type()->AsFloat()) {
                         return true;
                       } else {
                         return false;
                       }
                     }))
      return nullptr;
    // All components of VectorConstant must be in the same type.
    const auto* component_type = components.front()->type();
    if (!std::all_of(components.begin(), components.end(),
                     [&component_type](const Constant* c) {
                       if (c->type() == component_type) return true;
                       return false;
                     }))
      return nullptr;
    return MakeUnique<VectorConstant>(vt, components);
  } else if (auto* mt = type->AsMatrix()) {
    auto components = GetConstantsFromIds(literal_words_or_ids);
    if (components.empty()) return nullptr;
    return MakeUnique<MatrixConstant>(mt, components);
  } else if (auto* st = type->AsStruct()) {
    auto components = GetConstantsFromIds(literal_words_or_ids);
    if (components.empty()) return nullptr;
    return MakeUnique<StructConstant>(st, components);
  } else if (auto* at = type->AsArray()) {
    auto components = GetConstantsFromIds(literal_words_or_ids);
    if (components.empty()) return nullptr;
    return MakeUnique<ArrayConstant>(at, components);
  } else {
    return nullptr;
  }
}